

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O1

QPDFObjectHandle __thiscall QPDF::readTrailer(QPDF *this)

{
  InputSource *input;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  int iVar4;
  qpdf_offset_t offset;
  qpdf_offset_t offset_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  QPDF *in_RSI;
  _Alloc_hider _Var6;
  bool bVar7;
  QPDFObjectHandle QVar8;
  string local_190;
  pair<QPDFObjectHandle,_bool> local_170;
  string local_158;
  string local_138;
  undefined1 local_118 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  _Alloc_hider local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Alloc_hider local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  undefined1 local_b0 [128];
  
  offset = (**(code **)(**(long **)&(((in_RSI->m)._M_t.
                                      super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                      .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                                    file).
                                    super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                       0x20))();
  input = (((in_RSI->m)._M_t.
            super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
            super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
            super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
          super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_b0._0_8_ = local_b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"trailer","");
  _Var1._M_head_impl =
       (in_RSI->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
       _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  QPDFParser::parse(&local_170,input,(string *)local_b0,&(_Var1._M_head_impl)->tokenizer,
                    (StringDecrypter *)0x0,in_RSI,(_Var1._M_head_impl)->in_xref_reconstruction);
  if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  if (local_170.second == true) {
    local_118._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_118 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"trailer","");
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_190,"empty object treated as null","");
    damagedPDF((QPDFExc *)local_b0,in_RSI,(string *)local_118,&local_190);
    warn(in_RSI,(QPDFExc *)local_b0);
    QPDFExc::~QPDFExc((QPDFExc *)local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    local_138.field_2._M_allocated_capacity = local_118._16_8_;
    _Var6._M_p = (pointer)local_118._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_118 + 0x10)) goto LAB_00229acb;
  }
  else {
    bVar3 = QPDFObjectHandle::isDictionary(&local_170.first);
    if (bVar3) {
      _Var1._M_head_impl =
           (in_RSI->m)._M_t.
           super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
           super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      ::qpdf::Tokenizer::readToken
                ((Token *)local_118,&(_Var1._M_head_impl)->tokenizer,
                 ((_Var1._M_head_impl)->file).
                 super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &(_Var1._M_head_impl)->last_object_description,true,0);
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"stream","");
      if ((local_118._0_4_ != tt_word) || (local_118._16_8_ != local_190._M_string_length))
      goto LAB_0022997f;
      if (local_118._16_8_ == 0) {
        bVar7 = true;
      }
      else {
        iVar4 = bcmp((void *)local_118._8_8_,local_190._M_dataplus._M_p,local_118._16_8_);
        bVar7 = iVar4 == 0;
      }
    }
    else {
LAB_0022997f:
      bVar7 = false;
    }
    if (bVar3) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_p != &local_c0) {
        operator_delete(local_d0._M_p,local_c0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_p != &local_e0) {
        operator_delete(local_f0._M_p,local_e0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._8_8_ != &local_100) {
        operator_delete((void *)local_118._8_8_,local_100._0_8_ + 1);
      }
    }
    if (!bVar7) goto LAB_00229acb;
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"trailer","");
    offset_00 = (**(code **)(**(long **)&(((in_RSI->m)._M_t.
                                           super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                           .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                          _M_head_impl)->file).
                                         super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                            + 0x20))();
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"stream keyword found in trailer","");
    damagedPDF((QPDFExc *)local_b0,in_RSI,&local_138,offset_00,&local_158);
    warn(in_RSI,(QPDFExc *)local_b0);
    QPDFExc::~QPDFExc((QPDFExc *)local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    _Var6._M_p = local_138._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p == &local_138.field_2) goto LAB_00229acb;
  }
  operator_delete(_Var6._M_p,local_138.field_2._M_allocated_capacity + 1);
LAB_00229acb:
  InputSource::setLastOffset
            ((((in_RSI->m)._M_t.
               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
             super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,offset);
  (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
       (Members *)
       local_170.first.super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this[1].m._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl =
       (Members *)
       local_170.first.super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((Members *)
      local_170.first.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi != (Members *)0x0
     ) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(local_170.first.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                       )->_vptr__Sp_counted_base + 8);
      *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
      UNLOCK();
    }
    else {
      p_Var2 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(local_170.first.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                       )->_vptr__Sp_counted_base + 8);
      *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
    }
  }
  _Var5._M_pi = extraout_RDX;
  if ((Members *)
      local_170.first.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi != (Members *)0x0
     ) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.first.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var5._M_pi = extraout_RDX_00;
  }
  QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var5._M_pi;
  QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::readTrailer()
{
    qpdf_offset_t offset = m->file->tell();
    auto [object, empty] = QPDFParser::parse(
        *m->file, "trailer", m->tokenizer, nullptr, *this, m->in_xref_reconstruction);
    if (empty) {
        // Nothing in the PDF spec appears to allow empty objects, but they have been encountered in
        // actual PDF files and Adobe Reader appears to ignore them.
        warn(damagedPDF("trailer", "empty object treated as null"));
    } else if (object.isDictionary() && readToken(*m->file).isWord("stream")) {
        warn(damagedPDF("trailer", m->file->tell(), "stream keyword found in trailer"));
    }
    // Override last_offset so that it points to the beginning of the object we just read
    m->file->setLastOffset(offset);
    return object;
}